

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O0

void __thiscall Runner::HandleParamBlock(Runner *this,ParamBlock *block,bool isConfigs)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  iterator iStack_58;
  float fval_1;
  _Self local_50;
  float local_44;
  iterator iStack_40;
  float fval;
  _Self local_38;
  uint16_t local_2e;
  uint local_2c;
  int16_t valInt;
  int i;
  uint uStack_20;
  bool hasPrev;
  int numParams;
  int startIdx;
  bool isConfigs_local;
  ParamBlock *block_local;
  Runner *this_local;
  
  numParams._3_1_ = isConfigs;
  _startIdx = block;
  block_local = (ParamBlock *)this;
  uVar2 = ntohs(block->startIdx);
  uStack_20 = (uint)uVar2;
  uVar2 = ntohs(_startIdx->numParams);
  i = (int)uVar2;
  if (((numParams._3_1_ & 1) != 0) &&
     (iVar3 = i + uStack_20,
     sVar4 = CLI::std::vector<int,_std::allocator<int>_>::size(&this->m_CurrConfigs),
     sVar4 < (ulong)(long)iVar3)) {
    CLI::std::vector<int,_std::allocator<int>_>::resize
              (&this->m_CurrConfigs,(long)(int)(i + uStack_20));
  }
  if (((numParams._3_1_ & 1) == 0) &&
     (iVar3 = i + uStack_20,
     sVar4 = CLI::std::vector<int,_std::allocator<int>_>::size(&this->m_CurrStatuses),
     sVar4 < (ulong)(long)iVar3)) {
    CLI::std::vector<int,_std::allocator<int>_>::resize
              (&this->m_CurrStatuses,(long)(int)(i + uStack_20));
  }
  if ((s_JSONOutput & 1U) != 0) {
    if ((numParams._3_1_ & 1) == 0) {
      printf("\"status\": {\n");
    }
    else {
      printf("\"config\": {\n");
    }
  }
  valInt._1_1_ = 0;
  for (local_2c = uStack_20; (int)local_2c < (int)(uStack_20 + i); local_2c = local_2c + 1) {
    local_2e = ntohs(_startIdx->payload[(int)(local_2c - uStack_20)]);
    if (local_2e != 0xaa55) {
      if ((numParams._3_1_ & 1) == 0) {
        iVar3 = (int)(short)local_2e;
        pvVar5 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->m_CurrStatuses,(long)(int)local_2c);
        *pvVar5 = iVar3;
        if ((s_JSONOutput & 1U) == 0) {
          local_50._M_node =
               (_Base_ptr)
               CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::find
                         (&this->m_TemperatureStatusIndices,(key_type *)&local_2c);
          iStack_58 = CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::end
                                (&this->m_TemperatureStatusIndices);
          bVar1 = CLI::std::operator!=(&local_50,&stack0xffffffffffffffa8);
          if (bVar1) {
            printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%.1f}\n",
                   (double)((float)(int)(short)local_2e / 10.0),(ulong)local_2c,(ulong)local_2c);
          }
          else {
            printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%d}\n",
                   (ulong)local_2c,(ulong)local_2c,(ulong)(uint)(int)(short)local_2e);
          }
        }
        else {
          if ((valInt._1_1_ & 1) != 0) {
            printf(",\n");
          }
          printf("\"%d\" : ",(ulong)local_2c);
          local_38._M_node =
               (_Base_ptr)
               CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::find
                         (&this->m_TemperatureStatusIndices,(key_type *)&local_2c);
          iStack_40 = CLI::std::set<int,_std::less<int>,_std::allocator<int>_>::end
                                (&this->m_TemperatureStatusIndices);
          bVar1 = CLI::std::operator!=(&local_38,&stack0xffffffffffffffc0);
          if (bVar1) {
            local_44 = (float)(int)(short)local_2e / 10.0;
            printf("%.1f",(double)local_44);
          }
          else {
            printf("%d",(ulong)(uint)(int)(short)local_2e);
          }
          valInt._1_1_ = 1;
        }
      }
      else {
        iVar3 = (int)(short)local_2e;
        pvVar5 = CLI::std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->m_CurrConfigs,(long)(int)local_2c);
        *pvVar5 = iVar3;
        if ((s_JSONOutput & 1U) == 0) {
          printf("/home/alsavo/config/%d={\"type\":\"config\", \"index\":%d, \"value\":%d}\n",
                 (ulong)local_2c,(ulong)local_2c,(ulong)(uint)(int)(short)local_2e);
        }
        else {
          if ((valInt._1_1_ & 1) != 0) {
            printf(",\n");
          }
          printf("\"%d\" : %d",(ulong)local_2c,(ulong)(uint)(int)(short)local_2e);
          valInt._1_1_ = 1;
        }
      }
    }
  }
  if ((s_JSONOutput & 1U) != 0) {
    printf("\n}");
    if ((numParams._3_1_ & 1) == 0) {
      printf(",");
    }
    printf("\n");
  }
  return;
}

Assistant:

void HandleParamBlock(ParamBlock* block, bool isConfigs)
	{
		int startIdx = ntohs(block->startIdx);
		int numParams = ntohs(block->numParams);
		if (isConfigs && numParams + startIdx > m_CurrConfigs.size())
			m_CurrConfigs.resize(numParams + startIdx);
		if (!isConfigs && numParams + startIdx > m_CurrStatuses.size())
			m_CurrStatuses.resize(numParams + startIdx);

		if(s_JSONOutput)
		{
			// Header
			if(isConfigs)
				printf("\"config\": {\n");
			else
				printf("\"status\": {\n");
		}

		bool hasPrev = false;
		for (int i = startIdx; i < startIdx + numParams; ++i)
		{
			int16_t valInt = ntohs(block->payload[i - startIdx]);
			if (valInt == -21931)
				continue;
			if(isConfigs)
			{
				m_CurrConfigs[i] = valInt;
				if(s_JSONOutput)
				{
					if(hasPrev)
						printf(",\n");
					printf("\"%d\" : %d", i, valInt);
					hasPrev = true;
				}
				else
				{
					printf("/home/alsavo/config/%d={\"type\":\"config\", \"index\":%d, \"value\":%d}\n",i, i, valInt);
				}
			}
			else
			{
				m_CurrStatuses[i] = valInt;
				if(s_JSONOutput)
				{
					if(hasPrev)
						printf(",\n");
					printf("\"%d\" : ", i);
					if (m_TemperatureStatusIndices.find(i) != m_TemperatureStatusIndices.end())
					{
						float fval = ((float)valInt) / 10.0f;
						printf("%.1f", fval);
					}
					else
						printf("%d", valInt);
					
					hasPrev = true;


				}
				else
				{
					if (m_TemperatureStatusIndices.find(i) != m_TemperatureStatusIndices.end())
					{
						float fval = ((float)valInt) / 10.0f;
						printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%.1f}\n", i, i, fval);
					}
					else
						printf("/home/alsavo/status/%d={\"type\":\"status\", \"index\":%d, \"value\":%d}\n", i, i, valInt);
				}
			}
		}
		if(s_JSONOutput)
		{
			printf("\n}");
			if(!isConfigs) // Status is printed out first
				printf(",");
			printf("\n");
		}

	}